

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidatePushElement(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  xmlRelaxNGGrammarPtr_conflict pxVar1;
  xmlRelaxNGDefinePtr_conflict pxVar2;
  bool bVar3;
  uint uVar4;
  xmlRegExecCtxtPtr exec;
  int iVar5;
  
  iVar5 = -1;
  uVar4 = 0xffffffff;
  if (elem != (xmlNodePtr)0x0 && ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
    if (ctxt->elem == (xmlRegExecCtxtPtr)0x0) {
      if (((ctxt->schema == (xmlRelaxNGPtr)0x0) ||
          (pxVar1 = ctxt->schema->topgrammar, pxVar1 == (xmlRelaxNGGrammarPtr_conflict)0x0)) ||
         (pxVar2 = pxVar1->start, pxVar2 == (xmlRelaxNGDefinePtr_conflict)0x0)) {
        bVar3 = false;
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOGRAMMAR,(xmlChar *)0x0,(xmlChar *)0x0,0);
        iVar5 = -1;
      }
      else if (pxVar2->contModel == (xmlRegexpPtr)0x0) {
        ctxt->pdef = pxVar2;
        bVar3 = false;
        iVar5 = 0;
      }
      else {
        exec = xmlRegNewExecCtxt(pxVar2->contModel,xmlRelaxNGValidateProgressiveCallback,ctxt);
        if (exec == (xmlRegExecCtxtPtr)0x0) {
          iVar5 = -1;
          bVar3 = false;
        }
        else {
          xmlRelaxNGElemPush(ctxt,exec);
          bVar3 = true;
        }
      }
      if (!bVar3) {
        return iVar5;
      }
    }
    ctxt->pnode = elem;
    ctxt->pstate = 0;
    if (elem->ns == (xmlNs *)0x0) {
      uVar4 = xmlRegExecPushString(ctxt->elem,elem->name,ctxt);
    }
    else {
      uVar4 = xmlRegExecPushString2(ctxt->elem,elem->name,elem->ns->href,ctxt);
    }
    if ((int)uVar4 < 0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_ELEMWRONG,elem->name,(xmlChar *)0x0,0);
    }
    else if (ctxt->pstate == 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = ctxt->pstate >> 0x1f | 1;
    }
  }
  return uVar4;
}

Assistant:

int
xmlRelaxNGValidatePushElement(xmlRelaxNGValidCtxtPtr ctxt,
                              xmlDocPtr doc ATTRIBUTE_UNUSED,
                              xmlNodePtr elem)
{
    int ret = 1;

    if ((ctxt == NULL) || (elem == NULL))
        return (-1);

#ifdef DEBUG_PROGRESSIVE
    xmlGenericError(xmlGenericErrorContext, "PushElem %s\n", elem->name);
#endif
    if (ctxt->elem == 0) {
        xmlRelaxNGPtr schema;
        xmlRelaxNGGrammarPtr grammar;
        xmlRegExecCtxtPtr exec;
        xmlRelaxNGDefinePtr define;

        schema = ctxt->schema;
        if (schema == NULL) {
            VALID_ERR(XML_RELAXNG_ERR_NOGRAMMAR);
            return (-1);
        }
        grammar = schema->topgrammar;
        if ((grammar == NULL) || (grammar->start == NULL)) {
            VALID_ERR(XML_RELAXNG_ERR_NOGRAMMAR);
            return (-1);
        }
        define = grammar->start;
        if (define->contModel == NULL) {
            ctxt->pdef = define;
            return (0);
        }
        exec = xmlRegNewExecCtxt(define->contModel,
                                 xmlRelaxNGValidateProgressiveCallback,
                                 ctxt);
        if (exec == NULL) {
            return (-1);
        }
        xmlRelaxNGElemPush(ctxt, exec);
    }
    ctxt->pnode = elem;
    ctxt->pstate = 0;
    if (elem->ns != NULL) {
        ret =
            xmlRegExecPushString2(ctxt->elem, elem->name, elem->ns->href,
                                  ctxt);
    } else {
        ret = xmlRegExecPushString(ctxt->elem, elem->name, ctxt);
    }
    if (ret < 0) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMWRONG, elem->name);
    } else {
        if (ctxt->pstate == 0)
            ret = 0;
        else if (ctxt->pstate < 0)
            ret = -1;
        else
            ret = 1;
    }
#ifdef DEBUG_PROGRESSIVE
    if (ret < 0)
        xmlGenericError(xmlGenericErrorContext, "PushElem %s failed\n",
                        elem->name);
#endif
    return (ret);
}